

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZGenGrid3D.cpp
# Opt level: O3

void __thiscall
TPZGenGrid3D::TPZGenGrid3D
          (TPZGenGrid3D *this,TPZVec<double> *minX,TPZVec<double> *maxX,TPZVec<int> *nelDiv,
          MMeshType meshType)

{
  int **ppiVar1;
  double **ppdVar2;
  ulong uVar3;
  int *piVar4;
  double *pdVar5;
  int iVar6;
  int *piVar7;
  double *pdVar8;
  ostream *poVar9;
  ulong uVar10;
  ulong uVar11;
  size_t lineN;
  double **ppdVar12;
  
  this->fGmesh = (TPZGeoMesh *)0x0;
  this->fMeshType = meshType;
  (this->fNelDiv).super_TPZVec<int>.fStore = (int *)0x0;
  (this->fNelDiv).super_TPZVec<int>.fNElements = 0;
  (this->fNelDiv).super_TPZVec<int>.fNAlloc = 0;
  (this->fNelDiv).super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_0181bce8;
  uVar3 = nelDiv->fNElements;
  if ((long)uVar3 < 4) {
    piVar7 = (this->fNelDiv).fExtAlloc;
    (this->fNelDiv).super_TPZVec<int>.fStore = piVar7;
    (this->fNelDiv).super_TPZVec<int>.fNElements = uVar3;
    (this->fNelDiv).super_TPZVec<int>.fNAlloc = 0;
    if (0 < (long)uVar3) goto LAB_0143e87e;
  }
  else {
    piVar7 = (int *)operator_new__(-(ulong)(uVar3 >> 0x3e != 0) | uVar3 * 4);
    (this->fNelDiv).super_TPZVec<int>.fStore = piVar7;
    (this->fNelDiv).super_TPZVec<int>.fNElements = uVar3;
    (this->fNelDiv).super_TPZVec<int>.fNAlloc = uVar3;
LAB_0143e87e:
    piVar4 = nelDiv->fStore;
    uVar10 = 0;
    do {
      piVar7[uVar10] = piVar4[uVar10];
      uVar10 = uVar10 + 1;
    } while (uVar3 != uVar10);
  }
  (this->fMinX).super_TPZVec<double>.fStore = (double *)0x0;
  (this->fMinX).super_TPZVec<double>.fNElements = 0;
  (this->fMinX).super_TPZVec<double>.fNAlloc = 0;
  (this->fMinX).super_TPZVec<double>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01819f98;
  uVar3 = minX->fNElements;
  if ((long)uVar3 < 4) {
    pdVar8 = (this->fMinX).fExtAlloc;
    (this->fMinX).super_TPZVec<double>.fStore = pdVar8;
    (this->fMinX).super_TPZVec<double>.fNElements = uVar3;
    (this->fMinX).super_TPZVec<double>.fNAlloc = 0;
    if (0 < (long)uVar3) goto LAB_0143e917;
  }
  else {
    pdVar8 = (double *)operator_new__(-(ulong)(uVar3 >> 0x3d != 0) | uVar3 * 8);
    (this->fMinX).super_TPZVec<double>.fStore = pdVar8;
    (this->fMinX).super_TPZVec<double>.fNElements = uVar3;
    (this->fMinX).super_TPZVec<double>.fNAlloc = uVar3;
LAB_0143e917:
    pdVar5 = minX->fStore;
    uVar10 = 0;
    do {
      pdVar8[uVar10] = pdVar5[uVar10];
      uVar10 = uVar10 + 1;
    } while (uVar3 != uVar10);
  }
  (this->fMaxX).super_TPZVec<double>.fStore = (double *)0x0;
  (this->fMaxX).super_TPZVec<double>.fNElements = 0;
  (this->fMaxX).super_TPZVec<double>.fNAlloc = 0;
  (this->fMaxX).super_TPZVec<double>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01819f98;
  uVar10 = maxX->fNElements;
  if ((long)uVar10 < 4) {
    pdVar8 = (this->fMaxX).fExtAlloc;
    (this->fMaxX).super_TPZVec<double>.fStore = pdVar8;
    (this->fMaxX).super_TPZVec<double>.fNElements = uVar10;
    (this->fMaxX).super_TPZVec<double>.fNAlloc = 0;
    if ((long)uVar10 < 1) goto LAB_0143e9fe;
  }
  else {
    pdVar8 = (double *)operator_new__(-(ulong)(uVar10 >> 0x3d != 0) | uVar10 * 8);
    (this->fMaxX).super_TPZVec<double>.fStore = pdVar8;
    (this->fMaxX).super_TPZVec<double>.fNElements = uVar10;
    (this->fMaxX).super_TPZVec<double>.fNAlloc = uVar10;
  }
  pdVar5 = maxX->fStore;
  uVar11 = 0;
  do {
    pdVar8[uVar11] = pdVar5[uVar11];
    uVar11 = uVar11 + 1;
  } while (uVar10 != uVar11);
  if (((uVar3 == 3) && ((this->fMaxX).super_TPZVec<double>.fNElements == 3)) &&
     ((this->fNelDiv).super_TPZVec<int>.fNElements == 3)) {
    iVar6 = MMeshType_Dimension(meshType);
    if (iVar6 == 3) {
      ppiVar1 = &(this->fNelDiv).super_TPZVec<int>.fStore;
      piVar7 = *ppiVar1;
      if (((*piVar7 < 1) || (piVar7[1] < 1)) || (piVar7[2] < 1)) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,
                   "TPZGenGrid3D::TPZGenGrid3D(const TPZVec<REAL> &, const TPZVec<REAL> &, const TPZVec<int> &, const MMeshType)"
                   ,0x6c);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," error\n",7);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,
                   "The read number of grid divisions is not allowed. The parameters are:\n",0x46);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"nel x: ",7);
        poVar9 = (ostream *)std::ostream::operator<<(&std::cerr,**ppiVar1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,"nel y: ",7);
        poVar9 = (ostream *)std::ostream::operator<<(poVar9,(*ppiVar1)[1]);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,"nel z: ",7);
        poVar9 = (ostream *)std::ostream::operator<<(poVar9,(*ppiVar1)[2]);
        lineN = 0x23;
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
      }
      else {
        ppdVar2 = &(this->fMaxX).super_TPZVec<double>.fStore;
        pdVar8 = *ppdVar2;
        if (((*pdVar8 < 1e-12) || (pdVar8[1] < 1e-12)) || (pdVar8[2] < 1e-12)) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,
                     "TPZGenGrid3D::TPZGenGrid3D(const TPZVec<REAL> &, const TPZVec<REAL> &, const TPZVec<int> &, const MMeshType)"
                     ,0x6c);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," error\n",7);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"Dimensions of grid not allowed. The parameters are:\n",
                     0x34);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"max x: ",7);
          poVar9 = std::ostream::_M_insert<double>(**ppdVar2);
          std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
          std::__ostream_insert<char,std::char_traits<char>>(poVar9,"max y: ",7);
          poVar9 = std::ostream::_M_insert<double>((*ppdVar2)[1]);
          std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
          std::__ostream_insert<char,std::char_traits<char>>(poVar9,"max z: ",7);
          poVar9 = std::ostream::_M_insert<double>((*ppdVar2)[2]);
          lineN = 0x28;
          std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
        }
        else {
          ppdVar12 = &(this->fMinX).super_TPZVec<double>.fStore;
          pdVar5 = *ppdVar12;
          if (((*pdVar5 <= *pdVar8) && (pdVar5[1] <= pdVar8[1])) && (pdVar5[2] <= pdVar8[2])) {
            return;
          }
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,
                     "TPZGenGrid3D::TPZGenGrid3D(const TPZVec<REAL> &, const TPZVec<REAL> &, const TPZVec<int> &, const MMeshType)"
                     ,0x6c);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," error\n",7);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"Dimensions of grid not allowed. The parameters are:\n",
                     0x34);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"min x: ",7);
          poVar9 = std::ostream::_M_insert<double>(**ppdVar12);
          std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
          std::__ostream_insert<char,std::char_traits<char>>(poVar9,"min y: ",7);
          poVar9 = std::ostream::_M_insert<double>((*ppdVar12)[1]);
          std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
          std::__ostream_insert<char,std::char_traits<char>>(poVar9,"min z: ",7);
          poVar9 = std::ostream::_M_insert<double>((*ppdVar12)[2]);
          std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"max x: ",7);
          poVar9 = std::ostream::_M_insert<double>(**ppdVar2);
          std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
          std::__ostream_insert<char,std::char_traits<char>>(poVar9,"max y: ",7);
          poVar9 = std::ostream::_M_insert<double>((*ppdVar2)[1]);
          std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
          std::__ostream_insert<char,std::char_traits<char>>(poVar9,"max z: ",7);
          poVar9 = std::ostream::_M_insert<double>((*ppdVar2)[2]);
          lineN = 0x2f;
          std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
        }
      }
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,
                 "TPZGenGrid3D::TPZGenGrid3D(const TPZVec<REAL> &, const TPZVec<REAL> &, const TPZVec<int> &, const MMeshType)"
                 ,0x6c);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," error\n",7);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Element type ",0xd);
      poVar9 = ::operator<<((ostream *)&std::cerr,this->fMeshType);
      lineN = 0x1d;
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar9," is not supported. Aborting...\n",0x1f);
    }
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Pre/TPZGenGrid3D.cpp"
               ,lineN);
  }
LAB_0143e9fe:
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,
             "TPZGenGrid3D::TPZGenGrid3D(const TPZVec<REAL> &, const TPZVec<REAL> &, const TPZVec<int> &, const MMeshType)"
             ,0x6c);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," error\n",7);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"minX, maxX and nelDiv must have size = 3!\n",0x2a);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"size(minX) = ",0xd);
  poVar9 = std::ostream::_M_insert<long>((long)&std::cerr);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,"size(maxX) = ",0xd);
  poVar9 = std::ostream::_M_insert<long>((long)poVar9);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,"size(nelDiv) = ",0xf);
  poVar9 = std::ostream::_M_insert<long>((long)poVar9);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
  pzinternal::DebugStopImpl
            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Pre/TPZGenGrid3D.cpp"
             ,0x18);
}

Assistant:

TPZGenGrid3D::TPZGenGrid3D(const TPZVec<REAL> &minX, const TPZVec<REAL> &maxX, const TPZVec<int> &nelDiv, const MMeshType meshType)
                           :fGmesh{nullptr}, fMinX{minX}, fMaxX{maxX},fNelDiv{nelDiv},fMeshType{meshType}{
    const REAL tol{ZeroTolerance()};
    if(fMinX.NElements() != 3 || fMaxX.NElements() != 3 || fNelDiv.NElements() != 3){
        PZError<<__PRETTY_FUNCTION__<<" error\n";
        PZError<<"minX, maxX and nelDiv must have size = 3!\n";
        PZError<<"size(minX) = "<<fMinX.NElements()<<"\n"
               <<"size(maxX) = "<<fMaxX.NElements()<<"\n"
               <<"size(nelDiv) = "<<fNelDiv.NElements()<<"\n";
        DebugStop();
    }
    if(MMeshType_Dimension(fMeshType) != fDim){
        PZError<<__PRETTY_FUNCTION__<<" error\n";
        PZError<<"Element type "<<fMeshType<<" is not supported. Aborting...\n";
        DebugStop();
    }
    else if(fNelDiv[0] < 1 || fNelDiv[1] < 1 || fNelDiv[2] < 1){
        PZError<<__PRETTY_FUNCTION__<<" error\n";
        PZError<<"The read number of grid divisions is not allowed. The parameters are:\n";
        PZError<<"nel x: "<<fNelDiv[0]<<"\n"<<"nel y: "<<fNelDiv[1]<<"\n"<<"nel z: "<<fNelDiv[2]<<"\n";
        DebugStop();
    }else if(fMaxX[0] < tol || fMaxX[1] < tol || fMaxX[2] < tol){
        PZError<<__PRETTY_FUNCTION__<<" error\n";
        PZError<<"Dimensions of grid not allowed. The parameters are:\n";
        PZError<<"max x: "<<fMaxX[0]<<"\n"<<"max y: "<<fMaxX[1]<<"\n"<<"max z: "<<fMaxX[2]<<"\n";
        DebugStop();
    }
    else if(fMaxX[0] < fMinX[0] || fMaxX[1] < fMinX[1] || fMaxX[2] < fMinX[2]){
        PZError<<__PRETTY_FUNCTION__<<" error\n";
        PZError<<"Dimensions of grid not allowed. The parameters are:\n";
        PZError<<"min x: "<<fMinX[0]<<"\n"<<"min y: "<<fMinX[1]<<"\n"<<"min z: "<<fMinX[2]<<"\n";
        PZError<<"max x: "<<fMaxX[0]<<"\n"<<"max y: "<<fMaxX[1]<<"\n"<<"max z: "<<fMaxX[2]<<"\n";
        DebugStop();
    }
}